

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk.c
# Opt level: O0

int mbedtls_pk_can_do(mbedtls_pk_context_conflict *ctx,mbedtls_pk_type_t type)

{
  mbedtls_pk_type_t type_local;
  mbedtls_pk_context_conflict *ctx_local;
  
  if ((ctx == (mbedtls_pk_context_conflict *)0x0) || (ctx->pk_info == (mbedtls_pk_info_t *)0x0)) {
    ctx_local._4_4_ = 0;
  }
  else {
    ctx_local._4_4_ = (*ctx->pk_info->can_do)(type);
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_pk_can_do(const mbedtls_pk_context *ctx, mbedtls_pk_type_t type)
{
    /* A context with null pk_info is not set up yet and can't do anything.
     * For backward compatibility, also accept NULL instead of a context
     * pointer. */
    if (ctx == NULL || ctx->pk_info == NULL) {
        return 0;
    }

    return ctx->pk_info->can_do(type);
}